

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::clear
          (SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *this)

{
  EntryPoint *pEVar1;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size;
  if (uVar3 != 0) {
    lVar5 = 0x10;
    uVar6 = 0;
    do {
      pEVar1 = (this->super_VectorView<diligent_spirv_cross::EntryPoint>).ptr;
      plVar2 = *(long **)((long)pEVar1 + lVar5 + -0x10);
      plVar4 = (long *)((long)&(pEVar1->name)._M_dataplus._M_p + lVar5);
      if (plVar4 != plVar2) {
        operator_delete(plVar2,*plVar4 + 1);
        uVar3 = (this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < uVar3);
  }
  (this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}